

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall Selector::Selector(Selector *this,char *name)

{
  int iVar1;
  char *name_00;
  
  EventDispatcher::EventDispatcher(&this->super_EventDispatcher);
  (this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher =
       (_func_int **)&PTR_sendEventSync_00130750;
  JetHead::list<Selector::ListenerNode_*>::list(&this->mList);
  Mutex::Mutex(&this->mLock,true);
  name_00 = "Selector";
  if (name != (char *)0x0) {
    name_00 = name;
  }
  JHThread::Thread::Thread(&(this->mThread).super_Thread,name_00,0);
  (this->mThread).super_Thread._vptr_Thread = (_func_int **)&PTR__Thread_001307f0;
  (this->mThread).mObject = this;
  (this->mThread).mFunc = (thread_main_type)threadMain;
  *(undefined8 *)&(this->mThread).field_0x48 = 0;
  (this->mThread).mStop = false;
  (this->mThread).mHardStop = false;
  this->mUpdateFds = false;
  Condition::Condition(&this->mCondition);
  iVar1 = pipe(this->mPipe);
  if (iVar1 != 0) {
    jh_log_print(1,"Selector::Selector(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                 ,0x33,"failed to create pipe");
  }
  this->mRunning = true;
  JHThread::Thread::Start(&(this->mThread).super_Thread);
  this->mShutdown = false;
  return;
}

Assistant:

Selector::Selector( const char *name ) : mLock( true ), 
	mThread( name == NULL ? "Selector" : name, this, &Selector::threadMain ),
	mUpdateFds( false )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int res = pipe( mPipe );
	
	LOG( "pipe reader %d writer %d", mPipe[ PIPE_READER ], mPipe[ PIPE_WRITER ] );
	
	if ( res != 0 )
		LOG_ERR_FATAL( "failed to create pipe" );	

	mRunning = true;
	mThread.Start();
	mShutdown = false;
}